

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O0

int Abc_SopGetVarNum(char *pSop)

{
  char *local_20;
  char *pCur;
  char *pSop_local;
  
  local_20 = pSop;
  while( true ) {
    if (*local_20 == '\n') {
      return ((int)local_20 - (int)pSop) + -2;
    }
    if (*local_20 == '\0') break;
    local_20 = local_20 + 1;
  }
  return -1;
}

Assistant:

int Abc_SopGetVarNum( char * pSop )
{
    char * pCur;
    for ( pCur = pSop; *pCur != '\n'; pCur++ )
        if ( *pCur == 0 )
            return -1;
    return pCur - pSop - 2;
}